

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::TextureBuffer::TextureBuffer
          (TextureBuffer *this,int dim_,TextureFormat format_,uint sizeX_,uint sizeY_,uint sizeZ_)

{
  uint64_t uVar1;
  allocator local_49;
  string local_48;
  string local_28;
  
  this->_vptr_TextureBuffer = (_func_int **)&PTR__TextureBuffer_005959c0;
  this->dim = dim_;
  this->format = format_;
  this->sizeX = sizeX_;
  this->sizeY = sizeY_;
  this->sizeZ = sizeZ_;
  uVar1 = *(uint64_t *)(render::engine + 0x290);
  *(uint64_t *)(render::engine + 0x290) = uVar1 + 1;
  this->uniqueID = uVar1;
  if (0x400000 < sizeX_) {
    std::__cxx11::string::string
              ((string *)&local_28,"OpenGL error: invalid texture dimensions",&local_49);
    exception(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    dim_ = this->dim;
  }
  if ((1 < dim_) && (0x400000 < this->sizeY)) {
    std::__cxx11::string::string
              ((string *)&local_48,"OpenGL error: invalid texture dimensions",&local_49);
    exception(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

TextureBuffer::TextureBuffer(int dim_, TextureFormat format_, unsigned int sizeX_, unsigned int sizeY_,
                             unsigned int sizeZ_)
    : dim(dim_), format(format_), sizeX(sizeX_), sizeY(sizeY_), sizeZ(sizeZ_),
      uniqueID(render::engine->getNextUniqueID()) {
  if (sizeX > (1 << 22)) exception("OpenGL error: invalid texture dimensions");
  if (dim > 1 && sizeY > (1 << 22)) exception("OpenGL error: invalid texture dimensions");
}